

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

HT_CPUUsageContext * ht_cpu_usage_context_create(void *process_id)

{
  int iVar1;
  __pid_t local_28;
  int status;
  HT_CPUUsageContext *context;
  void *process_id_local;
  
  iVar1 = pthread_once(&_clock_ticks_per_sec_once_control,_init_clock_ticks_per_sec);
  if (iVar1 == 0) {
    process_id_local = ht_alloc(0x18);
    if ((HT_CPUUsageContext *)process_id_local == (HT_CPUUsageContext *)0x0) {
      process_id_local = (void *)0x0;
    }
    else {
      ((HT_CPUUsageContext *)process_id_local)->last_probe = 0;
      if (process_id == (void *)0x0) {
        local_28 = getpid();
      }
      else {
        local_28 = *process_id;
      }
      ((HT_CPUUsageContext *)process_id_local)->pid = local_28;
      ((HT_CPUUsageContext *)process_id_local)->last_total_time = 0;
      ht_cpu_usage_get_percentage((HT_CPUUsageContext *)process_id_local);
      ((HT_CPUUsageContext *)process_id_local)->value = 0.0;
    }
  }
  else {
    process_id_local = (void *)0x0;
  }
  return (HT_CPUUsageContext *)process_id_local;
}

Assistant:

HT_CPUUsageContext*
ht_cpu_usage_context_create(void* process_id)
{
    HT_CPUUsageContext* context = NULL;

    int status = pthread_once(&_clock_ticks_per_sec_once_control, _init_clock_ticks_per_sec);

    if (status != 0)
    {
        return NULL;
    }

    context = HT_CREATE_TYPE(HT_CPUUsageContext);

    if (context == NULL)
    {
        return NULL;
    }

    context->last_probe = 0;
    context->pid = process_id == NULL ? getpid() : *(int*)process_id;
    context->last_total_time = 0;

    ht_cpu_usage_get_percentage(context);
    context->value = 0.0f;

    return context;
}